

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryManager.cpp
# Opt level: O2

void __thiscall MemoryManager::~MemoryManager(MemoryManager *this)

{
  void *pvVar1;
  uint8_t **(*__range1) [1024];
  void *pvVar2;
  long lVar3;
  uint16_t j;
  long lVar4;
  
  for (lVar3 = 0; lVar3 != 0x2000; lVar3 = lVar3 + 8) {
    if (*(long *)((long)this->memory + lVar3) != 0) {
      for (lVar4 = 0; pvVar2 = *(void **)((long)this->memory + lVar3), lVar4 != 0x400;
          lVar4 = lVar4 + 1) {
        pvVar1 = *(void **)((long)pvVar2 + lVar4 * 8);
        if (pvVar1 != (void *)0x0) {
          operator_delete__(pvVar1);
          pvVar2 = *(void **)((long)this->memory + lVar3);
        }
        *(undefined8 *)((long)pvVar2 + lVar4 * 8) = 0;
      }
      if (pvVar2 != (void *)0x0) {
        operator_delete__(pvVar2);
      }
      *(undefined8 *)((long)this->memory + lVar3) = 0;
    }
  }
  return;
}

Assistant:

MemoryManager::~MemoryManager(){
    for(auto & i : this->memory){
        if(i){
            for(uint16_t j = 0; j < 1024; j++){
                if(i[j])
                    delete[] i[j];
                i[j] = nullptr;
            }
            delete[] i;
            i = nullptr;
        }
    }
}